

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall QComboBoxPrivateContainer::updateTopBottomMargin(QComboBoxPrivateContainer *this)

{
  long lVar1;
  int iVar2;
  int h;
  QLayout *pQVar3;
  QBoxLayout *pQVar4;
  QStyle *pQVar5;
  long *plVar6;
  QSpacerItem *this_00;
  QSpacerItem *this_01;
  long in_FS_OFFSET;
  QStyleOptionComboBox opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QWidget::layout((QWidget *)this);
  if (pQVar3 != (QLayout *)0x0) {
    pQVar3 = QWidget::layout((QWidget *)this);
    iVar2 = (**(code **)(*(long *)pQVar3 + 200))(pQVar3);
    if (0 < iVar2) {
      pQVar3 = QWidget::layout((QWidget *)this);
      pQVar4 = QtPrivate::qobject_cast_helper<QBoxLayout*,QObject>(&pQVar3->super_QObject);
      if (pQVar4 != (QBoxLayout *)0x0) {
        memset(&opt,0xaa,0x90);
        comboStyleOption(&opt,this);
        pQVar5 = QWidget::style(&this->combo->super_QWidget);
        h = 0;
        iVar2 = (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0x19,&opt,this->combo);
        if (iVar2 != 0) {
          pQVar5 = QWidget::style(&this->combo->super_QWidget);
          h = (**(code **)(*(long *)pQVar5 + 0xe0))(pQVar5,0x1d,&opt,this->combo);
        }
        plVar6 = (long *)(**(code **)(*(long *)&pQVar4->super_QLayout + 0xa8))(pQVar4);
        this_00 = (QSpacerItem *)(**(code **)(*plVar6 + 0x78))(plVar6);
        if (this_00 != (QSpacerItem *)0x0) {
          QSpacerItem::changeSize(this_00,0,h,Minimum,Fixed);
        }
        (**(code **)(*(long *)&pQVar4->super_QLayout + 200))(pQVar4);
        plVar6 = (long *)(**(code **)(*(long *)&pQVar4->super_QLayout + 0xa8))(pQVar4);
        this_01 = (QSpacerItem *)(**(code **)(*plVar6 + 0x78))(plVar6);
        if ((this_01 != (QSpacerItem *)0x0) && (this_01 != this_00)) {
          QSpacerItem::changeSize(this_01,0,h,Minimum,Fixed);
        }
        (**(code **)(*(long *)&pQVar4->super_QLayout + 0x70))(pQVar4);
        QStyleOptionComboBox::~QStyleOptionComboBox(&opt);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivateContainer::updateTopBottomMargin()
{
    if (!layout() || layout()->count() < 1)
        return;

    QBoxLayout *boxLayout = qobject_cast<QBoxLayout *>(layout());
    if (!boxLayout)
        return;

    const QStyleOptionComboBox opt = comboStyleOption();
    const bool usePopup = combo->style()->styleHint(QStyle::SH_ComboBox_Popup, &opt, combo);
    const int margin = usePopup ? combo->style()->pixelMetric(QStyle::PM_MenuVMargin, &opt, combo) : 0;

    QSpacerItem *topSpacer = boxLayout->itemAt(0)->spacerItem();
    if (topSpacer)
        topSpacer->changeSize(0, margin, QSizePolicy::Minimum, QSizePolicy::Fixed);

    QSpacerItem *bottomSpacer = boxLayout->itemAt(boxLayout->count() - 1)->spacerItem();
    if (bottomSpacer && bottomSpacer != topSpacer)
        bottomSpacer->changeSize(0, margin, QSizePolicy::Minimum, QSizePolicy::Fixed);

    boxLayout->invalidate();
}